

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stack.c
# Opt level: O3

void ts_stack_clear(Stack *self)

{
  Length *pLVar1;
  Length *pLVar2;
  char *__s;
  ReusableNode *self_00;
  SubtreePool *pool;
  byte bVar3;
  ushort uVar4;
  TSStateId state;
  TSStateId state_00;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  uint uVar11;
  uint uVar12;
  undefined4 uVar13;
  undefined4 uVar14;
  StackHead *pSVar15;
  SubtreeHeapData *pSVar16;
  _func_void_void_ptr_TSLogType_char_ptr *p_Var17;
  undefined4 uVar21;
  size_t sVar18;
  TSPoint TVar19;
  undefined4 uVar22;
  undefined4 uVar23;
  TSRange *pTVar20;
  bool bVar24;
  Lexer *pLVar25;
  uint32_t uVar26;
  undefined4 uVar27;
  _Bool _Var28;
  byte bVar29;
  char cVar30;
  TSSymbol TVar31;
  ushort uVar32;
  TSSymbol TVar33;
  int iVar34;
  StackVersion SVar35;
  ErrorComparison EVar36;
  StackVersion SVar37;
  TSParser *pTVar38;
  StackEntry *pSVar39;
  undefined8 uVar40;
  undefined8 uVar41;
  Subtree SVar42;
  MutableSubtree subtree;
  uint32_t uVar43;
  char *pcVar44;
  byte bVar45;
  bool bVar46;
  void *unaff_RBX;
  TSRangeArray *pTVar47;
  long lVar48;
  StackVersion v1;
  Subtree *pSVar49;
  anon_union_40_3_c1cdc900_for_SubtreeHeapData_17 *paVar50;
  TSParser *self_01;
  Stack *pSVar51;
  TSLanguage *pTVar52;
  StackEntry *pSVar53;
  char *in_R8;
  TSRangeArray *pTVar54;
  ulong uVar55;
  _func_char_ptr_void_ptr_uint32_t_TSPoint_uint32_t_ptr *unaff_R12;
  _func_char_ptr_void_ptr_uint32_t_TSPoint_uint32_t_ptr *p_Var56;
  ulong uVar57;
  uint32_t uVar58;
  ushort uVar59;
  undefined8 unaff_R14;
  TSRangeArray *pTVar60;
  ulong uVar61;
  uint32_t *puVar62;
  long lVar63;
  _Bool *p_Var64;
  bool bVar65;
  bool bVar66;
  Length LVar67;
  Length LVar68;
  Length padding;
  Length padding_00;
  Length LVar69;
  Length padding_01;
  Length size;
  Length size_00;
  Length size_01;
  ErrorStatus EVar70;
  ErrorStatus a;
  ErrorStatus b;
  uint uStack_1b8;
  uint uStack_1b4;
  undefined1 auStack_1a8 [8];
  uint uStack_1a0;
  Subtree SStack_188;
  uint uStack_180;
  uint32_t uStack_17c;
  anon_union_40_3_c1cdc900_for_SubtreeHeapData_17 *paStack_178;
  Length *pLStack_170;
  ulong uStack_168;
  uint32_t uStack_160;
  uint32_t uStack_15c;
  undefined8 uStack_158;
  uint32_t uStack_150;
  uint uStack_14c;
  uint uStack_148;
  uint uStack_144;
  TableEntry TStack_140;
  Subtree SStack_130;
  Length *pLStack_128;
  TableEntry aTStack_120 [2];
  ulong uStack_f8;
  uint uStack_f0;
  int32_t iStack_ec;
  TSRangeArray *pTStack_e8;
  ulong uStack_e0;
  ulong uStack_d8;
  ulong uStack_d0;
  ulong uStack_c8;
  Length *pLStack_c0;
  Stack *pSStack_58;
  _func_char_ptr_void_ptr_uint32_t_TSPoint_uint32_t_ptr *p_Stack_50;
  
  stack_node_retain(self->base_node);
  p_Var56 = unaff_R12;
  if ((self->heads).size != 0) {
    lVar63 = 0;
    p_Var56 = (_func_char_ptr_void_ptr_uint32_t_TSPoint_uint32_t_ptr *)0x0;
    do {
      stack_head_delete((StackHead *)((long)&((self->heads).contents)->node + lVar63),
                        &self->node_pool,self->subtree_pool);
      p_Var56 = p_Var56 + 1;
      lVar63 = lVar63 + 0x28;
    } while (p_Var56 < (_func_char_ptr_void_ptr_uint32_t_TSPoint_uint32_t_ptr *)
                       (ulong)(self->heads).size);
  }
  (self->heads).size = 0;
  uVar11 = 0;
  pTVar38 = (TSParser *)(self->heads).contents;
  if ((self->heads).capacity != 0) goto LAB_0012c0ee;
  if (pTVar38 == (TSParser *)0x0) {
    self_01 = (TSParser *)&DAT_00000008;
    pSVar49 = (Subtree *)0x28;
    pTVar38 = (TSParser *)calloc(8,0x28);
    if (pTVar38 == (TSParser *)0x0) goto LAB_0012c12c;
    uVar11 = 0;
  }
  else {
    pSVar49 = (Subtree *)0x140;
    self_01 = pTVar38;
    pTVar38 = (TSParser *)realloc(pTVar38,0x140);
    if (pTVar38 == (TSParser *)0x0) {
      ts_stack_clear_cold_1();
LAB_0012c12c:
      ts_stack_clear_cold_2();
      if ((self_01->language == (TSLanguage *)0x0) ||
         (unaff_R12 == (_func_char_ptr_void_ptr_uint32_t_TSPoint_uint32_t_ptr *)0x0)) {
        return;
      }
      *(undefined8 *)&(self_01->lexer).input.encoding = unaff_R14;
      (self_01->lexer).input.payload = unaff_RBX;
      (self_01->lexer).input.read = unaff_R12;
      (self_01->lexer).data.lookahead = 0;
      (self_01->lexer).chunk = (char *)0x0;
      (self_01->lexer).chunk_start = 0;
      (self_01->lexer).chunk_size = 0;
      (self_01->lexer).lookahead_size = 0;
      pTStack_e8 = &self_01->included_range_differences;
      (self_01->included_range_differences).size = 0;
      self_01->included_range_difference_index = 0;
      pSStack_58 = self;
      p_Stack_50 = p_Var56;
      if ((self_01->lexer).current_position.bytes == 0) {
        uStack_158 = CONCAT44(uStack_158._4_4_,(uint32_t)uStack_158);
        if ((self_01->stack->heads).size == 0) {
LAB_0012ea52:
          __assert_fail("(uint32_t)version < (&self->heads)->size",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Aerijo[P]latex-language-server/third_party/tree-sitter/src/runtime/stack.c"
                        ,0x198,"TSStateId ts_stack_state(const Stack *, StackVersion)");
        }
        if (((self_01->stack->heads).contents)->node->state != 1) goto LAB_0012c264;
        if (pSVar49 != (Subtree *)0x0) {
          ts_subtree_retain(*pSVar49);
          self_01->old_tree = *pSVar49;
          in_R8 = (char *)pTStack_e8;
          ts_range_array_get_changed_ranges
                    ((TSRange *)pSVar49[4].ptr,*(uint *)(pSVar49 + 5),
                     (self_01->lexer).included_ranges,(uint)(self_01->lexer).included_range_count,
                     pTStack_e8);
          SVar42 = *pSVar49;
          (self_01->reusable_node).stack.size = 0;
          (self_01->reusable_node).last_external_token.ptr = (SubtreeHeapData *)0x0;
          uVar11 = 0;
          pSVar39 = (self_01->reusable_node).stack.contents;
          if ((self_01->reusable_node).stack.capacity == 0) {
            if (pSVar39 == (StackEntry *)0x0) {
              pSVar53 = (StackEntry *)&DAT_00000008;
              pSVar39 = (StackEntry *)calloc(8,0x10);
              if (pSVar39 == (StackEntry *)0x0) goto LAB_0012eb0a;
              uVar11 = 0;
            }
            else {
              pSVar53 = pSVar39;
              pSVar39 = (StackEntry *)realloc(pSVar39,0x80);
              if (pSVar39 == (StackEntry *)0x0) {
                ts_parser_parse_cold_1();
LAB_0012eb0a:
                ts_parser_parse_cold_2();
                if (pSVar53[10].tree.ptr != (SubtreeHeapData *)0x0) {
                  uVar40._0_4_ = pSVar53[9].child_index;
                  uVar40._4_4_ = pSVar53[9].byte_offset;
                  (*(code *)pSVar53[10].tree)(uVar40,0,&pSVar53[10].child_index);
                }
                if (*(FILE **)&pSVar53[0x58].child_index != (FILE *)0x0) {
                  fwrite("graph {\nlabel=\"",0xf,1,*(FILE **)&pSVar53[0x58].child_index);
                  puVar62 = &pSVar53[10].child_index;
                  do {
                    cVar30 = (char)*puVar62;
                    if (cVar30 == '\"') {
                      fputc(0x5c,*(FILE **)&pSVar53[0x58].child_index);
                      cVar30 = (char)*puVar62;
                    }
                    else if (cVar30 == '\0') {
                      fwrite("\"\n}\n\n",5,1,*(FILE **)&pSVar53[0x58].child_index);
                      return;
                    }
                    fputc((int)cVar30,*(FILE **)&pSVar53[0x58].child_index);
                    puVar62 = (uint32_t *)((long)puVar62 + 1);
                  } while( true );
                }
                return;
              }
              uVar11 = (self_01->reusable_node).stack.size;
            }
            (self_01->reusable_node).stack.contents = pSVar39;
            (self_01->reusable_node).stack.capacity = 8;
          }
          (self_01->reusable_node).stack.size = uVar11 + 1;
          pSVar39[uVar11].tree = SVar42;
          pSVar39[uVar11].child_index = 0;
          pSVar39[uVar11].byte_offset = 0;
          if (((self_01->lexer).logger.log != (_func_void_void_ptr_TSLogType_char_ptr *)0x0) ||
             (self_01->dot_graph_file != (FILE *)0x0)) {
            builtin_strncpy((self_01->lexer).debug_buffer,"parse_after_edit",0x11);
            ts_parser__log(self_01);
          }
          uVar11 = (self_01->included_range_differences).size;
          if (uVar11 != 0) {
            lVar63 = 0x14;
            uVar57 = 0;
            do {
              pTVar20 = (self_01->included_range_differences).contents;
              if (((self_01->lexer).logger.log != (_func_void_void_ptr_TSLogType_char_ptr *)0x0) ||
                 (self_01->dot_graph_file != (FILE *)0x0)) {
                in_R8 = (char *)(ulong)*(uint *)((long)&(pTVar20->start_point).row + lVar63);
                snprintf((self_01->lexer).debug_buffer,0x400,"different_included_range %u - %u",
                         (ulong)*(uint *)((long)pTVar20 + lVar63 + -4));
                ts_parser__log(self_01);
                uVar11 = (self_01->included_range_differences).size;
              }
              uVar57 = uVar57 + 1;
              lVar63 = lVar63 + 0x18;
            } while (uVar57 < uVar11);
          }
          goto LAB_0012c2a2;
        }
        (self_01->reusable_node).stack.size = 0;
        (self_01->reusable_node).last_external_token.ptr = (SubtreeHeapData *)0x0;
        if (((self_01->lexer).logger.log == (_func_void_void_ptr_TSLogType_char_ptr *)0x0) &&
           (self_01->dot_graph_file == (FILE *)0x0)) goto LAB_0012c2a2;
        builtin_strncpy((self_01->lexer).debug_buffer,"new_parse",10);
      }
      else {
LAB_0012c264:
        if (((self_01->lexer).logger.log == (_func_void_void_ptr_TSLogType_char_ptr *)0x0) &&
           (self_01->dot_graph_file == (FILE *)0x0)) goto LAB_0012c2a2;
        builtin_strncpy(pLVar25->debug_buffer,"resume_parsing",0xf);
        pLVar25 = &self_01->lexer;
      }
      ts_parser__log(self_01);
LAB_0012c2a2:
      lVar63 = CONCAT44(uStack_158._4_4_,(uint32_t)uStack_158);
      pLStack_170 = &(self_01->lexer).current_position;
      __s = (self_01->lexer).debug_buffer;
      self_00 = &self_01->reusable_node;
      pLStack_128 = &(self_01->lexer).token_end_position;
      pLStack_c0 = &(self_01->lexer).token_start_position;
      pool = &self_01->tree_pool;
      uStack_c8 = 0;
      uStack_f0 = 0;
      uVar40 = 0;
      do {
        uStack_180 = (self_01->stack->heads).size;
        uStack_1b8 = 0xffffffff;
        if (uStack_180 == 0) {
LAB_0012e5a3:
          bVar65 = true;
        }
        else {
          pTVar47 = (TSRangeArray *)0x0;
          do {
            if (self_01->operation_limit < uStack_c8) {
              return;
            }
            if (self_01->enabled != true) {
              return;
            }
            uStack_c8 = uStack_c8 + 1;
LAB_0012c35f:
            pSVar51 = self_01->stack;
            uVar11 = (pSVar51->heads).size;
            pTVar54 = (TSRangeArray *)(ulong)uVar11;
            if (pTVar54 <= pTVar47) {
              uStack_158 = lVar63;
              __assert_fail("(uint32_t)version < (&self->heads)->size",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Aerijo[P]latex-language-server/third_party/tree-sitter/src/runtime/stack.c"
                            ,0x2a8,"_Bool ts_stack_is_active(const Stack *, StackVersion)");
            }
            pSVar15 = (pSVar51->heads).contents;
            uStack_158 = (long)pTVar47 * 5;
            if (pSVar15[(long)pTVar47].status == StackStatusActive) {
              SVar37 = (StackVersion)pTVar47;
              if (((self_01->lexer).logger.log != (_func_void_void_ptr_TSLogType_char_ptr *)0x0) ||
                 (pTVar60 = pTVar54, lVar63 = uStack_158, self_01->dot_graph_file != (FILE *)0x0)) {
                uVar59 = (pSVar15[(long)pTVar47].node)->state;
                LVar67 = ts_stack_position(pSVar51,SVar37);
                LVar68 = ts_stack_position(self_01->stack,SVar37);
                snprintf(__s,0x400,"process version:%d, version_count:%u, state:%d, row:%u, col:%u",
                         (ulong)pTVar47 & 0xffffffff,pTVar54,(ulong)uVar59,LVar67._0_8_ >> 0x20,
                         (ulong)LVar68.extent.column);
                ts_parser__log(self_01);
                pSVar51 = self_01->stack;
                pTVar60 = (TSRangeArray *)(ulong)(pSVar51->heads).size;
                in_R8 = (char *)pTVar54;
                lVar63 = uStack_158;
              }
              uStack_158 = lVar63;
              if (pTVar47 < pTVar60) {
                uVar59 = (&((pSVar51->heads).contents)->node)[lVar63]->state;
                LVar67 = ts_stack_position(pSVar51,SVar37);
                if ((TSRangeArray *)(ulong)(self_01->stack->heads).size <= pTVar47)
                goto LAB_0012ea14;
                SStack_130 = (&((self_01->stack->heads).contents)->last_external_token)[lVar63];
                SStack_188.ptr = (SubtreeHeapData *)0x0;
                TStack_140.actions._0_4_ = 0;
                TStack_140.actions._4_4_ = 0;
                TStack_140.action_count = 0;
                TStack_140.is_reusable = false;
                TStack_140._13_3_ = 0;
                uVar11 = LVar67.bytes;
                if (uStack_180 == 1) {
LAB_0012c480:
                  uVar12 = (self_01->reusable_node).stack.size;
                  if (uVar12 != 0) {
                    pSVar39 = (self_00->stack).contents;
                    SVar42 = (Subtree)pSVar39[uVar12 - 1].tree.ptr;
                    if (SVar42.ptr == (SubtreeHeapData *)0x0) goto LAB_0012cc38;
                    if (((ulong)SVar42.ptr & 1) == 0) {
                      uVar7 = ((Length *)((long)SVar42 + 4))->bytes;
                      uVar8 = ((Length *)((long)SVar42 + 0x10))->bytes;
                    }
                    else {
                      uVar7 = SVar42._2_4_ & 0xff;
                      uVar8 = SVar42._3_4_ & 0xff;
                    }
                    uVar5 = pSVar39[uVar12 - 1].byte_offset;
                    uVar7 = uVar7 + uVar8 + uVar5;
                    bVar45 = SVar42.data.symbol;
                    if (uVar11 < uVar5) {
                      if (((self_01->lexer).logger.log !=
                           (_func_void_void_ptr_TSLogType_char_ptr *)0x0) ||
                         (self_01->dot_graph_file != (FILE *)0x0)) {
                        if (((ulong)SVar42.ptr & 1) == 0) {
                          TVar33 = (SVar42.ptr)->symbol;
                        }
                        else {
                          TVar33 = (TSSymbol)bVar45;
                        }
                        pcVar44 = "ERROR";
                        if (TVar33 != 0xffff) {
                          if (TVar33 == 0xfffe) {
                            pcVar44 = "_ERROR";
                          }
                          else {
                            pcVar44 = self_01->language->symbol_names[TVar33];
                          }
                        }
                        snprintf(__s,0x400,"before_reusable_node symbol:%s",pcVar44);
                        ts_parser__log(self_01);
                      }
                      goto LAB_0012cc38;
                    }
                    if (uVar5 < uVar11) {
                      if (((self_01->lexer).logger.log !=
                           (_func_void_void_ptr_TSLogType_char_ptr *)0x0) ||
                         (self_01->dot_graph_file != (FILE *)0x0)) {
                        if (((ulong)SVar42.ptr & 1) == 0) {
                          TVar33 = (SVar42.ptr)->symbol;
                        }
                        else {
                          TVar33 = (TSSymbol)bVar45;
                        }
                        pcVar44 = "ERROR";
                        if (TVar33 != 0xffff) {
                          if (TVar33 == 0xfffe) {
                            pcVar44 = "_ERROR";
                          }
                          else {
                            pcVar44 = self_01->language->symbol_names[TVar33];
                          }
                        }
                        snprintf(__s,0x400,"past_reusable_node symbol:%s",pcVar44);
                        ts_parser__log(self_01);
                      }
                      if (uVar11 < uVar7) {
                        uVar12 = (self_01->reusable_node).stack.size;
                        if (uVar12 == 0) goto LAB_0012ea33;
                        pSVar39 = (self_00->stack).contents;
                        pSVar16 = pSVar39[uVar12 - 1].tree.ptr;
                        if ((((ulong)pSVar16 & 1) == 0) && (pSVar16->child_count != 0)) {
                          uVar43 = pSVar39[uVar12 - 1].byte_offset;
                          if (uVar12 == (self_01->reusable_node).stack.capacity) {
                            uVar7 = uVar12 * 2;
                            if (uVar7 < 9) {
                              uVar7 = 8;
                            }
                            if (uVar12 < uVar7) {
                              pSVar39 = (StackEntry *)realloc(pSVar39,(ulong)uVar7 << 4);
                              if (pSVar39 == (StackEntry *)0x0) goto LAB_0012ea98;
                              (self_01->reusable_node).stack.contents = pSVar39;
                              (self_01->reusable_node).stack.capacity = uVar7;
                              uVar12 = (self_01->reusable_node).stack.size;
                            }
                          }
                          (self_01->reusable_node).stack.size = uVar12 + 1;
                          pSVar49 = (pSVar16->field_17).field_0.children;
                          goto LAB_0012c8d0;
                        }
                      }
                    }
                    else {
                      _Var28 = ts_subtree_external_scanner_state_eq
                                         ((self_01->reusable_node).last_external_token,SStack_130);
                      if (_Var28) {
                        if (((ulong)SVar42.ptr & 1) == 0) {
                          uVar32 = *(ushort *)&(SVar42.ptr)->field_0x2c;
                          pcVar44 = "has_changes";
                          if (((((uVar32 & 0x20) == 0) &&
                               (pcVar44 = "is_error", (SVar42.ptr)->symbol != 0xffff)) &&
                              (pcVar44 = "is_missing", -1 < (char)uVar32)) &&
                             (pcVar44 = "is_fragile", (uVar32 & 0x18) == 0)) goto LAB_0012c57a;
                        }
                        else {
                          pcVar44 = "has_changes";
                          if ((((ulong)SVar42.ptr & 0x10) == 0) &&
                             (pcVar44 = "is_missing", ((ulong)SVar42.ptr & 0x20) == 0)) {
LAB_0012c57a:
                            uVar8 = (self_01->included_range_differences).size;
                            uVar6 = self_01->included_range_difference_index;
                            if (uVar6 < uVar8) {
                              iVar34 = uVar8 - uVar6;
                              puVar62 = &pTStack_e8->contents[uVar6].end_byte;
                              while (*puVar62 <= uVar5) {
                                puVar62 = puVar62 + 6;
                                iVar34 = iVar34 + -1;
                                if (iVar34 == 0) goto LAB_0012c95c;
                              }
                              pcVar44 = "contains_different_included_range";
                              if (puVar62[-1] < uVar7) goto LAB_0012c7b1;
                            }
LAB_0012c95c:
                            if (((ulong)SVar42.ptr & 1) == 0) {
                              if ((SVar42.ptr)->child_count == 0) {
                                TVar33 = (SVar42.ptr)->symbol;
                              }
                              else {
                                TVar33 = ((SVar42.ptr)->field_17).field_0.first_leaf.symbol;
                              }
                            }
                            else {
                              TVar33 = (TSSymbol)bVar45;
                            }
                            ts_language_table_entry(self_01->language,uVar59,TVar33,&TStack_140);
                            pTVar38 = (TSParser *)self_01->language;
                            _Var28 = ts_parser__can_reuse_first_leaf
                                               (pTVar38,uVar59,SVar42,&TStack_140);
                            p_Var17 = (self_01->lexer).logger.log;
                            if (_Var28) {
                              if ((p_Var17 != (_func_void_void_ptr_TSLogType_char_ptr *)0x0) ||
                                 (self_01->dot_graph_file != (FILE *)0x0)) {
                                if (((ulong)SVar42.ptr & 1) == 0) {
                                  TVar33 = (SVar42.ptr)->symbol;
                                }
                                else {
                                  TVar33 = (TSSymbol)bVar45;
                                }
                                pcVar44 = "ERROR";
                                if (TVar33 != 0xffff) {
                                  if (TVar33 == 0xfffe) {
                                    pcVar44 = "_ERROR";
                                  }
                                  else {
                                    pcVar44 = *(char **)((pTVar38->lexer).data.get_column +
                                                        (ulong)TVar33 * 8);
                                  }
                                }
                                snprintf(__s,0x400,"reuse_node symbol:%s",pcVar44);
                                ts_parser__log(self_01);
                              }
                              ts_subtree_retain(SVar42);
                              bVar65 = false;
                              goto LAB_0012d6af;
                            }
                            if ((p_Var17 != (_func_void_void_ptr_TSLogType_char_ptr *)0x0) ||
                               (self_01->dot_graph_file != (FILE *)0x0)) {
                              if (((ulong)SVar42.ptr & 1) == 0) {
                                TVar31 = (SVar42.ptr)->symbol;
                              }
                              else {
                                TVar31 = (TSSymbol)bVar45;
                              }
                              pcVar44 = "ERROR";
                              if (TVar31 != 0xffff) {
                                if (TVar31 == 0xfffe) {
                                  pcVar44 = "_ERROR";
                                }
                                else {
                                  pcVar44 = *(char **)((pTVar38->lexer).data.get_column +
                                                      (ulong)TVar31 * 8);
                                }
                              }
                              in_R8 = "ERROR";
                              if (TVar33 != 0xffff) {
                                if (TVar33 == 0xfffe) {
                                  in_R8 = "_ERROR";
                                }
                                else {
                                  in_R8 = *(char **)((pTVar38->lexer).data.get_column +
                                                    (ulong)TVar33 * 8);
                                }
                              }
                              snprintf(__s,0x400,"cant_reuse_node symbol:%s, first_leaf_symbol:%s",
                                       pcVar44);
                              ts_parser__log(self_01);
                            }
                            uVar12 = (self_01->reusable_node).stack.size;
                            goto LAB_0012cb6e;
                          }
                        }
LAB_0012c7b1:
                        if (((self_01->lexer).logger.log !=
                             (_func_void_void_ptr_TSLogType_char_ptr *)0x0) ||
                           (self_01->dot_graph_file != (FILE *)0x0)) {
                          if (((ulong)SVar42.ptr & 1) == 0) {
                            TVar33 = (SVar42.ptr)->symbol;
                          }
                          else {
                            TVar33 = (TSSymbol)bVar45;
                          }
                          in_R8 = "ERROR";
                          if (TVar33 != 0xffff) {
                            if (TVar33 == 0xfffe) {
                              in_R8 = "_ERROR";
                            }
                            else {
                              in_R8 = self_01->language->symbol_names[TVar33];
                            }
                          }
                          snprintf(__s,0x400,"cant_reuse_node_%s tree:%s",pcVar44);
                          ts_parser__log(self_01);
                          uVar12 = (self_01->reusable_node).stack.size;
                        }
                        if (uVar12 == 0) goto LAB_0012ea33;
                        pSVar39 = (self_00->stack).contents;
                        pSVar16 = pSVar39[uVar12 - 1].tree.ptr;
                        if ((((ulong)pSVar16 & 1) == 0) && (pSVar16->child_count != 0)) {
                          uVar43 = pSVar39[uVar12 - 1].byte_offset;
                          if (uVar12 == (self_01->reusable_node).stack.capacity) {
                            uVar7 = uVar12 * 2;
                            if (uVar12 * 2 < 9) {
                              uVar7 = 8;
                            }
                            if (uVar12 < uVar7) {
                              pSVar39 = (StackEntry *)realloc(pSVar39,(ulong)uVar7 << 4);
                              if (pSVar39 == (StackEntry *)0x0) {
                                ts_parser_parse_cold_4();
                                goto LAB_0012eac7;
                              }
                              (self_01->reusable_node).stack.contents = pSVar39;
                              (self_01->reusable_node).stack.capacity = uVar7;
                              uVar12 = (self_01->reusable_node).stack.size;
                            }
                          }
                          (self_01->reusable_node).stack.size = uVar12 + 1;
                          pSVar49 = (pSVar16->field_17).field_0.children;
LAB_0012c8d0:
                          pSVar39[uVar12].tree = *pSVar49;
                          pSVar39[uVar12].child_index = 0;
                          pSVar39[uVar12].byte_offset = uVar43;
                        }
                        else {
                          reusable_node_advance(self_00);
                          ts_parser__breakdown_top_of_stack(self_01,SVar37);
                          if ((TSRangeArray *)(ulong)(self_01->stack->heads).size <= pTVar47)
                          goto LAB_0012ea52;
                          uVar59 = (&((self_01->stack->heads).contents)->node)[uStack_158]->state;
                        }
                        goto LAB_0012c480;
                      }
                      if (((self_01->lexer).logger.log !=
                           (_func_void_void_ptr_TSLogType_char_ptr *)0x0) ||
                         (self_01->dot_graph_file != (FILE *)0x0)) {
                        if (((ulong)SVar42.ptr & 1) == 0) {
                          TVar33 = (SVar42.ptr)->symbol;
                        }
                        else {
                          TVar33 = (TSSymbol)bVar45;
                        }
                        pcVar44 = "ERROR";
                        if (TVar33 != 0xffff) {
                          if (TVar33 == 0xfffe) {
                            pcVar44 = "_ERROR";
                          }
                          else {
                            pcVar44 = self_01->language->symbol_names[TVar33];
                          }
                        }
                        snprintf(__s,0x400,
                                 "reusable_node_has_different_external_scanner_state symbol:%s",
                                 pcVar44);
                        ts_parser__log(self_01);
                      }
                    }
                    reusable_node_advance(self_00);
                    goto LAB_0012c480;
                  }
                }
                goto LAB_0012cc38;
              }
              goto LAB_0012ea52;
            }
LAB_0012de4f:
            uStack_180 = uVar11;
            pTVar47 = (TSRangeArray *)((long)&pTVar47->contents + 1);
          } while (pTVar47 < pTVar54);
          bVar65 = uStack_180 == 0;
          if (bVar65) goto LAB_0012e5a3;
          bVar24 = false;
          uStack_1b8 = 0xffffffff;
          lVar48 = 0;
          do {
            SVar37 = (StackVersion)lVar48;
            uStack_158 = lVar63;
            if ((pSVar51->heads).contents[lVar48].status == StackStatusHalted) {
              ts_stack_remove_version(pSVar51,SVar37);
              lVar63 = uStack_158;
            }
            else {
              EVar70 = ts_parser__version_status(self_01,SVar37);
              uVar57 = EVar70._8_8_;
              uVar41 = EVar70._0_8_;
              uVar11 = EVar70.cost;
              if (uStack_1b8 < EVar70.cost) {
                uVar11 = uStack_1b8;
              }
              if ((uVar57 >> 0x20 & 1) == 0) {
                uStack_1b8 = uVar11;
              }
              if (SVar37 != 0) {
                EVar70 = ts_parser__version_status(self_01,0);
                a.dynamic_precedence = (int)uVar41;
                a.is_in_error = (_Bool)(char)((ulong)uVar41 >> 0x20);
                a._13_3_ = (int3)((ulong)uVar41 >> 0x28);
                a.cost = (int)EVar70._8_8_;
                a.node_count = (int)((ulong)EVar70._8_8_ >> 0x20);
                b._8_8_ = in_R8;
                b.cost = (int)uVar57;
                b.node_count = (int)(uVar57 >> 0x20);
                EVar36 = ts_parser__compare_versions(EVar70._0_8_,a,b);
                (*(code *)(&DAT_001a05f0 + *(int *)(&DAT_001a05f0 + (ulong)EVar36 * 4)))();
                return;
              }
              lVar48 = 1;
              lVar63 = uStack_158;
            }
            pSVar51 = self_01->stack;
            uVar11 = (pSVar51->heads).size;
          } while ((uint)lVar48 < uVar11);
          uStack_158 = lVar63;
          if (6 < uVar11) {
            do {
              ts_stack_remove_version(pSVar51,6);
              pSVar51 = self_01->stack;
              uVar11 = (pSVar51->heads).size;
            } while (6 < uVar11);
            bVar24 = true;
          }
          if (uVar11 != 0) {
            uVar57 = 0;
            bVar46 = false;
            do {
              pSVar51 = self_01->stack;
              uVar12 = (uint)uVar57;
              if ((pSVar51->heads).size <= uVar12) {
LAB_0012eac7:
                __assert_fail("(uint32_t)version < (&self->heads)->size",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/Aerijo[P]latex-language-server/third_party/tree-sitter/src/runtime/stack.c"
                              ,0x2b0,"_Bool ts_stack_is_paused(const Stack *, StackVersion)");
              }
              if ((pSVar51->heads).contents[uVar57].status == StackStatusPaused) {
                if ((!bVar46) && (self_01->accept_count < 6)) {
                  uStack_f8 = CONCAT44(uStack_f8._4_4_,uVar11);
                  if (((self_01->lexer).logger.log != (_func_void_void_ptr_TSLogType_char_ptr *)0x0)
                     || (self_01->dot_graph_file != (FILE *)0x0)) {
                    snprintf(__s,0x400,"resume version:%u");
                    ts_parser__log(self_01);
                    pSVar51 = self_01->stack;
                  }
                  uStack_1b8 = ts_stack_error_cost(pSVar51,uVar12);
                  TVar33 = ts_stack_resume(self_01->stack,uVar12);
                  uVar7 = (self_01->stack->heads).size;
                  ts_parser__do_all_potential_reductions(self_01,uVar12,0);
                  uVar11 = (self_01->stack->heads).size;
                  LVar67 = ts_stack_position(self_01->stack,uVar12);
                  uStack_160 = LVar67.bytes;
                  uStack_15c = LVar67.extent.row;
                  uStack_158._0_4_ = LVar67.extent.column;
                  paStack_178 = (anon_union_40_3_c1cdc900_for_SubtreeHeapData_17 *)
                                CONCAT44(paStack_178._4_4_,uVar11);
                  if (uVar12 < uVar11) {
                    bVar46 = false;
                    uStack_168 = CONCAT44(uStack_168._4_4_,uVar7);
                    uVar11 = uVar12;
                    do {
                      bVar66 = !bVar46;
                      bVar46 = true;
                      if (bVar66) {
                        if ((self_01->stack->heads).size <= uVar11) goto LAB_0012ea52;
                        pTVar52 = self_01->language;
                        if (pTVar52->token_count < 2) {
                          bVar46 = false;
                        }
                        else {
                          uVar59 = 1;
                          state = ((self_01->stack->heads).contents[uVar11].node)->state;
                          do {
                            if ((uVar59 < 0xfffe) &&
                               (ts_language_table_entry(pTVar52,state,uVar59,aTStack_120),
                               aTStack_120[0].action_count != 0)) {
                              state_00 = *(TSStateId *)
                                          (CONCAT44(aTStack_120[0].actions._4_4_,
                                                    (uint32_t)aTStack_120[0].actions) +
                                          (ulong)(aTStack_120[0].action_count - 1) * 8);
                              bVar45 = *(byte *)(CONCAT44(aTStack_120[0].actions._4_4_,
                                                          (uint32_t)aTStack_120[0].actions) + 6 +
                                                (ulong)(aTStack_120[0].action_count - 1) * 8);
                              if ((((bVar45 & 0xf) == 3) || ((bVar45 & 0xf) == 0)) &&
                                 (((state_00 != 0 &&
                                   (ts_language_table_entry
                                              (self_01->language,state_00,TVar33,aTStack_120),
                                   uVar58 = uStack_15c, uVar43 = uStack_160,
                                   aTStack_120[0].action_count != 0)) &&
                                  ((*(byte *)(CONCAT44(aTStack_120[0].actions._4_4_,
                                                       (uint32_t)aTStack_120[0].actions) + 6) & 0xf)
                                   == 1)))) {
                                auStack_1a8._4_4_ = uStack_15c;
                                auStack_1a8._0_4_ = uStack_160;
                                if (pLStack_170->bytes != uStack_160) {
                                  LVar67.extent.column = (uint32_t)uStack_158;
                                  LVar67.bytes = uStack_160;
                                  LVar67.extent.row = uStack_15c;
                                  ts_lexer_goto(&self_01->lexer,LVar67);
                                }
                                sVar18 = (self_01->lexer).current_included_range_index;
                                if ((sVar18 == 0) ||
                                   (pTVar20 = (self_01->lexer).included_ranges,
                                   pLStack_170->bytes != pTVar20[sVar18].start_byte)) {
                                  (pLStack_128->extent).column = (pLStack_170->extent).column;
                                  uVar26 = (pLStack_170->extent).row;
                                  pLStack_128->bytes = pLStack_170->bytes;
                                  (pLStack_128->extent).row = uVar26;
                                  TStack_140.action_count =
                                       (self_01->lexer).token_end_position.extent.column;
                                }
                                else {
                                  TVar19 = pTVar20[sVar18 - 1].end_point;
                                  (self_01->lexer).token_end_position.bytes =
                                       pTVar20[sVar18 - 1].end_byte;
                                  (self_01->lexer).token_end_position.extent = TVar19;
                                  TStack_140.action_count = TVar19.column;
                                }
                                uVar13 = pLStack_128->bytes;
                                uVar22 = (pLStack_128->extent).row;
                                uStack_1a0 = (uint32_t)uStack_158;
                                aTStack_120[0].actions._0_4_ = uVar13 - uVar43;
                                if (uVar58 < (uint)uVar22) {
                                  uVar57 = CONCAT44(TStack_140.action_count,uVar22 - uVar58);
                                }
                                else {
                                  uVar57 = CONCAT44(TStack_140.action_count,uVar22) -
                                           ((ulong)stack0xfffffffffffffe5c & 0xffffffff00000000) &
                                           0xffffffff00000000;
                                }
                                aTStack_120[0].actions._4_4_ = (undefined4)uVar57;
                                aTStack_120[0].action_count = (uint32_t)(uVar57 >> 0x20);
                                SStack_130._4_4_ = aTStack_120[0].actions._4_4_;
                                SStack_130._0_4_ = (uint32_t)aTStack_120[0].actions;
                                TStack_140.actions._0_4_ = uVar13;
                                TStack_140.actions._4_4_ = uVar22;
                                SVar37 = ts_stack_copy_version(self_01->stack,uVar11);
                                padding_01.extent.column = (uint32_t)(uVar57 >> 0x20);
                                padding_01._0_8_ = SStack_130.ptr;
                                SVar42 = ts_subtree_new_missing_leaf
                                                   (pool,uVar59,padding_01,self_01->language);
                                ts_stack_push(self_01->stack,SVar37,SVar42,false,state_00);
                                _Var28 = ts_parser__do_all_potential_reductions
                                                   (self_01,SVar37,TVar33);
                                uVar7 = (uint)uStack_168;
                                if (_Var28) {
                                  if (((self_01->lexer).logger.log !=
                                       (_func_void_void_ptr_TSLogType_char_ptr *)0x0) ||
                                     (self_01->dot_graph_file != (FILE *)0x0)) {
                                    if ((self_01->stack->heads).size <= SVar37) goto LAB_0012ea52;
                                    snprintf(__s,0x400,"recover_with_missing symbol:%s, state:%u");
                                    ts_parser__log(self_01);
                                  }
                                  bVar46 = true;
                                  goto LAB_0012e3ee;
                                }
                              }
                            }
                            uVar59 = uVar59 + 1;
                            pTVar52 = self_01->language;
                          } while ((uint)uVar59 < pTVar52->token_count);
                          bVar46 = false;
                        }
                      }
LAB_0012e3ee:
                      in_R8 = (char *)0x0;
                      ts_stack_push(self_01->stack,uVar11,(Subtree)0x0,false,0);
                      bVar66 = uVar11 == uVar12;
                      uVar11 = uVar11 + 1;
                      if (bVar66) {
                        uVar11 = uVar7;
                      }
                    } while (uVar11 < (uint)paStack_178);
                  }
                  uVar11 = (uint)uStack_f8;
                  uVar8 = (uint)paStack_178;
                  if (uVar7 < (uint)paStack_178) {
                    do {
                      _Var28 = ts_stack_merge(self_01->stack,uVar12,uVar7);
                      if (!_Var28) {
LAB_0012eaa0:
                        __assert_fail("ts_stack_merge(self->stack, version, previous_version_count)"
                                      ,
                                      "/workspace/llm4binary/github/license_all_cmakelists_25/Aerijo[P]latex-language-server/third_party/tree-sitter/src/runtime/parser.c"
                                      ,0x3c8,
                                      "void ts_parser__handle_error(TSParser *, StackVersion, TSSymbol)"
                                     );
                      }
                      uVar8 = uVar8 - 1;
                    } while (uVar7 != uVar8);
                  }
                  ts_stack_record_summary(self_01->stack,uVar12,0x10);
                  if (self_01->dot_graph_file != (FILE *)0x0) {
                    ts_stack_print_dot_graph
                              (self_01->stack,self_01->language,self_01->dot_graph_file);
                    fputs("\n\n",(FILE *)self_01->dot_graph_file);
                  }
                  goto LAB_0012e528;
                }
                ts_stack_remove_version(pSVar51,uVar12);
                uVar12 = uVar12 - 1;
                uVar11 = uVar11 - 1;
              }
              else {
LAB_0012e528:
                bVar46 = true;
              }
              uVar57 = (ulong)(uVar12 + 1);
            } while (uVar12 + 1 < uVar11);
          }
          lVar63 = uStack_158;
          if ((bVar24) &&
             (((self_01->lexer).logger.log != (_func_void_void_ptr_TSLogType_char_ptr *)0x0 ||
              (self_01->dot_graph_file != (FILE *)0x0)))) {
            builtin_strncpy(__s,"condense",9);
            ts_parser__log(self_01);
            lVar63 = uStack_158;
            if (self_01->dot_graph_file != (FILE *)0x0) {
              ts_stack_print_dot_graph(self_01->stack,self_01->language,self_01->dot_graph_file);
              fputs("\n\n",(FILE *)self_01->dot_graph_file);
              lVar63 = uStack_158;
            }
          }
        }
        SVar42 = (Subtree)(self_01->finished_tree).ptr;
        if (SVar42.ptr != (SubtreeHeapData *)0x0) {
          if (((ulong)SVar42.ptr & 1) == 0) {
            uVar11 = 0x262;
            if (((SVar42.ptr)->field_0x2c & 0x80) == 0) {
              uVar11 = (SVar42.ptr)->error_cost;
            }
          }
          else {
            uVar11 = 0x262;
            if (((ulong)SVar42.ptr & 0x20) == 0) {
              uVar11 = 0;
            }
          }
          if (uVar11 < uStack_1b8) goto LAB_0012e87c;
        }
        if ((self_01->halt_on_error == true) && (uStack_1b8 != 0)) {
          uStack_158 = lVar63;
          if (((self_01->lexer).logger.log != (_func_void_void_ptr_TSLogType_char_ptr *)0x0) ||
             (self_01->dot_graph_file != (FILE *)0x0)) {
            builtin_strncpy(__s,"halting_parse",0xe);
            ts_parser__log(self_01);
            if (self_01->dot_graph_file != (FILE *)0x0) {
              ts_stack_print_dot_graph(self_01->stack,self_01->language,self_01->dot_graph_file);
              fputs("\n\n",(FILE *)self_01->dot_graph_file);
            }
          }
          while ((self_01->lexer).data.lookahead != 0) {
            ts_lexer__advance((TSLexer *)self_01,false);
          }
          LVar67 = ts_stack_position(self_01->stack,0);
          uVar14 = (self_01->lexer).current_position.bytes;
          uVar23 = (self_01->lexer).current_position.extent.row;
          TStack_140.action_count = (self_01->lexer).current_position.extent.column;
          aTStack_120[0].actions._0_4_ = uVar14 - LVar67.bytes;
          stack0xfffffffffffffe5c = LVar67.extent;
          if (LVar67.extent.row < (uint)uVar23) {
            uVar57 = CONCAT44(TStack_140.action_count,uVar23 - LVar67.extent.row);
          }
          else {
            uVar57 = CONCAT44(TStack_140.action_count,uVar23) -
                     ((ulong)stack0xfffffffffffffe5c & 0xffffffff00000000) & 0xffffffff00000000;
          }
          aTStack_120[0].actions._4_4_ = (undefined4)uVar57;
          aTStack_120[0].action_count = (uint32_t)(uVar57 >> 0x20);
          size_01.extent.row = aTStack_120[0].actions._4_4_;
          size_01.bytes = (uint32_t)aTStack_120[0].actions;
          size_01.extent.column = (uint32_t)(uVar57 >> 0x20);
          TStack_140.actions._0_4_ = uVar14;
          TStack_140.actions._4_4_ = uVar23;
          SVar42 = ts_subtree_new_leaf(pool,0xffff,(Length)ZEXT812(0),size_01,
                                       (uint32_t)aTStack_120[0].actions,0,false,false,
                                       self_01->language);
          ((SVar42.ptr)->field_17).lookahead_char = 0;
          *(ushort *)&(SVar42.ptr)->field_0x2c =
               (ushort)*(undefined4 *)&(SVar42.ptr)->field_0x2c & 0xffe6 | 0x18;
          ts_stack_push(self_01->stack,0,SVar42,false,0);
          aTStack_120[0].actions._0_4_ = 0;
          aTStack_120[0].actions._4_4_ = 0;
          aTStack_120[0].action_count = 0;
          aTStack_120[0].is_reusable = false;
          aTStack_120[0]._13_3_ = 0;
          subtree = ts_subtree_new_node(pool,0xffff,(SubtreeArray *)aTStack_120,0,self_01->language)
          ;
          (subtree.ptr)->field_0x2c = (subtree.ptr)->field_0x2c & 0xfb;
          ts_stack_push(self_01->stack,0,(Subtree)subtree,false,0);
          SVar42 = ts_subtree_new_leaf(pool,0,(Length)ZEXT812(0),(Length)ZEXT812(0),0,0,false,false,
                                       self_01->language);
          ts_parser__accept(self_01,0,SVar42);
          SVar42 = self_01->finished_tree;
          lVar63 = uStack_158;
LAB_0012e87c:
          uStack_158 = lVar63;
          ts_subtree_balance(SVar42,pool,self_01->language);
          if (((self_01->lexer).logger.log != (_func_void_void_ptr_TSLogType_char_ptr *)0x0) ||
             (self_01->dot_graph_file != (FILE *)0x0)) {
            builtin_strncpy(__s,"done",5);
            ts_parser__log(self_01);
            if (self_01->dot_graph_file != (FILE *)0x0) {
              ts_subtree_print_dot_graph
                        (self_01->finished_tree,self_01->language,self_01->dot_graph_file);
              fputs("\n",(FILE *)self_01->dot_graph_file);
            }
          }
          ts_tree_new(self_01->finished_tree,self_01->language,(self_01->lexer).included_ranges,
                      (uint)(self_01->lexer).included_range_count);
          (self_01->finished_tree).ptr = (SubtreeHeapData *)0x0;
          ts_parser_reset(self_01);
          return;
        }
        uVar11 = (self_01->included_range_differences).size;
        uVar12 = self_01->included_range_difference_index;
        if (uVar12 < uVar11) {
          puVar62 = &pTStack_e8->contents[uVar12].end_byte;
          do {
            uVar12 = uVar12 + 1;
            if ((uint)uVar40 < *puVar62) break;
            self_01->included_range_difference_index = uVar12;
            puVar62 = puVar62 + 6;
          } while (uVar12 != uVar11);
        }
        if (bVar65) goto LAB_0012e87c;
      } while( true );
    }
    uVar11 = (self->heads).size;
  }
  (self->heads).contents = (StackHead *)pTVar38;
  (self->heads).capacity = 8;
LAB_0012c0ee:
  (self->heads).size = uVar11 + 1;
  *(StackNode **)(&(pTVar38->lexer).data + uVar11) = self->base_node;
  *(StackStatus *)&(&(pTVar38->lexer).data)[uVar11].is_at_included_range_start = StackStatusActive;
  pSVar49 = (Subtree *)&(&(pTVar38->lexer).data)[uVar11].advance;
  pSVar49->ptr = (SubtreeHeapData *)0x0;
  pSVar49[1].ptr = (SubtreeHeapData *)0x0;
  *(undefined8 *)((long)&(&(pTVar38->lexer).data)[uVar11].mark_end + 6) = 0;
  return;
LAB_0012cb6e:
  if (uVar12 == 0) {
LAB_0012ea33:
    __assert_fail("(uint32_t)(&self->stack)->size - 1 < (&self->stack)->size",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Aerijo[P]latex-language-server/third_party/tree-sitter/src/runtime/reusable_node.h"
                  ,0x48,"_Bool reusable_node_descend(ReusableNode *)");
  }
  pSVar39 = (self_00->stack).contents;
  pSVar16 = pSVar39[uVar12 - 1].tree.ptr;
  if ((((ulong)pSVar16 & 1) != 0) || (pSVar16->child_count == 0)) goto LAB_0012cc2e;
  uVar43 = pSVar39[uVar12 - 1].byte_offset;
  if (uVar12 == (self_01->reusable_node).stack.capacity) {
    uVar7 = uVar12 * 2;
    if (uVar7 < 9) {
      uVar7 = 8;
    }
    if (uVar12 < uVar7) {
      pSVar39 = (StackEntry *)realloc(pSVar39,(ulong)uVar7 << 4);
      if (pSVar39 == (StackEntry *)0x0) {
        ts_parser_parse_cold_3();
LAB_0012ea98:
        ts_parser_parse_cold_5();
        goto LAB_0012eaa0;
      }
      (self_01->reusable_node).stack.contents = pSVar39;
      (self_01->reusable_node).stack.capacity = uVar7;
      uVar12 = (self_01->reusable_node).stack.size;
    }
  }
  (self_01->reusable_node).stack.size = uVar12 + 1;
  pSVar39[uVar12].tree = *(pSVar16->field_17).field_0.children;
  pSVar39[uVar12].child_index = 0;
  pSVar39[uVar12].byte_offset = uVar43;
  uVar12 = (self_01->reusable_node).stack.size;
  goto LAB_0012cb6e;
LAB_0012de18:
  (self_01->lexer).data.result_symbol = 0xffff;
  bVar24 = false;
LAB_0012d103:
  uVar57 = uStack_168;
  uStack_14c = LVar68.extent.row;
  if ((uStack_f8 & 1) == 0) {
    if (pLStack_128->bytes < pLStack_c0->bytes) {
      (pLStack_c0->extent).column = (pLStack_128->extent).column;
      uVar58 = (pLStack_128->extent).row;
      pLStack_c0->bytes = pLStack_128->bytes;
      (pLStack_c0->extent).row = uVar58;
    }
    uVar32 = (self_01->lexer).data.result_symbol;
    pLVar1 = &(self_01->lexer).token_start_position;
    uVar9 = pLVar1->bytes;
    uVar21 = (pLVar1->extent).row;
    uStack_148 = (self_01->lexer).token_start_position.extent.column;
    stack0xfffffffffffffe5c = (*pLVar1).extent;
    uVar11 = (*pLVar1).extent;
    if (uStack_14c < uVar11) {
      uVar61 = (ulong)(uVar11 - uStack_14c) | (ulong)stack0xfffffffffffffe5c & 0xffffffff00000000;
    }
    else {
      uVar61 = (long)stack0xfffffffffffffe5c - ((ulong)LVar68.extent & 0xffffffff00000000) &
               0xffffffff00000000;
    }
    aTStack_120[0].actions._4_4_ = (undefined4)uVar61;
    uVar27 = aTStack_120[0].actions._4_4_;
    LVar69.extent.row = aTStack_120[0].actions._4_4_;
    LVar69.bytes = uVar9 - uVar43;
    pLVar2 = &(self_01->lexer).token_end_position;
    uVar10 = pLVar2->bytes;
    LVar68 = *pLVar2;
    aTStack_120[0].actions._0_4_ = uVar10 - uVar9;
    stack0xfffffffffffffe5c = LVar68.extent;
    uVar11 = LVar68.extent.row;
    if ((uint)uVar21 < uVar11) {
      uVar55 = (ulong)(uVar11 - uVar21) | (ulong)stack0xfffffffffffffe5c & 0xffffffff00000000;
    }
    else {
      uVar55 = (long)stack0xfffffffffffffe5c - ((ulong)uStack_148 << 0x20) & 0xffffffff00000000;
    }
    aTStack_120[0].actions._4_4_ = (undefined4)uVar55;
    aTStack_120[0].action_count = (uint32_t)(uVar55 >> 0x20);
    in_R8 = (char *)CONCAT44(aTStack_120[0].actions._4_4_,(uint32_t)aTStack_120[0].actions);
    uVar58 = uStack_17c - uVar10;
    pTVar52 = self_01->language;
    uStack_150 = uVar9;
    uStack_14c = uVar21;
    if (bVar24) {
      padding_00.extent.column = (uint32_t)(uVar61 >> 0x20);
      padding_00.bytes = uVar9 - uVar43;
      padding_00.extent.row = uVar27;
      size_00.extent.column = aTStack_120[0].action_count;
      size_00._0_8_ = in_R8;
      SVar42 = ts_subtree_new_leaf(pool,(pTVar52->external_scanner).symbol_map[uVar32],padding_00,
                                   size_00,uVar58,(TSStateId)uStack_168,true,false,pTVar52);
      uVar11 = (*(self_01->language->external_scanner).serialize)
                         (self_01->external_scanner_payload,__s);
      ts_external_scanner_state_init(&((SVar42.ptr)->field_17).external_scanner_state,__s,uVar11);
    }
    else {
      _Var28 = false;
      if ((uVar32 != 0) && (uVar32 == pTVar52->keyword_capture_token)) {
        if (pLStack_170->bytes != uVar9) {
          ts_lexer_goto(&self_01->lexer,*pLVar1);
        }
        ts_lexer_start(&self_01->lexer);
        _Var28 = (*self_01->language->keyword_lex_fn)((TSLexer *)self_01,0);
        if ((_Var28) && (pLStack_128->bytes == uVar10)) {
          ts_language_table_entry
                    (self_01->language,(TSStateId)uStack_168,(self_01->lexer).data.result_symbol,
                     aTStack_120);
          if (aTStack_120[0].action_count != 0) {
            uVar32 = (self_01->lexer).data.result_symbol;
            _Var28 = true;
            goto LAB_0012d53b;
          }
        }
        _Var28 = false;
      }
LAB_0012d53b:
      uVar57 = uStack_168;
      LVar69.extent.column = (uint32_t)(uVar61 >> 0x20);
      LVar68.extent.column = (uint32_t)(uVar55 >> 0x20);
      LVar68._0_8_ = in_R8;
      SVar42 = ts_subtree_new_leaf(pool,uVar32,LVar69,LVar68,uVar58,(TSStateId)uStack_168,false,
                                   _Var28,self_01->language);
    }
  }
  else {
    uStack_1a0 = uStack_144;
    auStack_1a8 = (undefined1  [8])uStack_e0;
    uStack_150 = (uint32_t)uStack_e0;
    uVar11 = (uint)(uStack_e0 >> 0x20);
    if (uStack_14c < uVar11) {
      uVar61 = (ulong)(uVar11 - uStack_14c) | (ulong)stack0xfffffffffffffe5c & 0xffffffff00000000;
    }
    else {
      uVar61 = (long)stack0xfffffffffffffe5c - ((ulong)LVar68.extent & 0xffffffff00000000) &
               0xffffffff00000000;
    }
    aTStack_120[0].actions._4_4_ = (undefined4)uVar61;
    padding.extent.row = aTStack_120[0].actions._4_4_;
    padding.bytes = uStack_150 - uVar43;
    uStack_1a0 = (int)uStack_d0;
    auStack_1a8 = (undefined1  [8])(uStack_d8 << 0x20);
    uStack_148 = uStack_144;
    aTStack_120[0].actions._0_4_ = uStack_160 - uStack_150;
    if (uVar11 < (uint)uStack_d8) {
      uVar55 = (ulong)((uint)uStack_d8 - uVar11) |
               (ulong)stack0xfffffffffffffe5c & 0xffffffff00000000;
    }
    else {
      uVar55 = (long)stack0xfffffffffffffe5c - ((ulong)uStack_144 << 0x20) & 0xffffffff00000000;
    }
    aTStack_120[0].actions._4_4_ = (undefined4)uVar55;
    aTStack_120[0].action_count = (uint32_t)(uVar55 >> 0x20);
    in_R8 = (char *)CONCAT44(aTStack_120[0].actions._4_4_,(uint32_t)aTStack_120[0].actions);
    padding.extent.column = (uint32_t)(uVar61 >> 0x20);
    size.extent.column = (uint32_t)(uVar55 >> 0x20);
    size._0_8_ = in_R8;
    uStack_14c = uVar11;
    SVar42 = ts_subtree_new_leaf(pool,0xffff,padding,size,uStack_17c - uStack_160,
                                 (TSStateId)uStack_168,false,false,self_01->language);
    (SVar42.ptr)->field_0x2c = (SVar42.ptr)->field_0x2c | 0x18;
    ((SVar42.ptr)->field_17).lookahead_char = iStack_ec;
  }
  if (((self_01->lexer).logger.log == (_func_void_void_ptr_TSLogType_char_ptr *)0x0) &&
     (self_01->dot_graph_file == (FILE *)0x0)) {
    ts_parser__set_cached_token(self_01,LVar67._0_8_ & 0xffffffff,SStack_130,SVar42);
    pTVar52 = self_01->language;
    if (((ulong)SVar42.ptr & 1) == 0) goto LAB_0012d68c;
LAB_0012d65d:
    TVar33 = (TSSymbol)SVar42.data.symbol;
  }
  else {
    if (((ulong)SVar42.ptr & 1) == 0) {
      TVar33 = (SVar42.ptr)->symbol;
    }
    else {
      TVar33 = (TSSymbol)SVar42.data.symbol;
    }
    pcVar44 = "ERROR";
    if (TVar33 != 0xffff) {
      if (TVar33 == 0xfffe) {
        pcVar44 = "_ERROR";
      }
      else {
        pcVar44 = self_01->language->symbol_names[TVar33];
      }
    }
    if (((ulong)SVar42.ptr & 1) == 0) {
      uVar11 = ((Length *)((long)SVar42 + 4))->bytes;
      uVar12 = ((Length *)((long)SVar42 + 0x10))->bytes;
    }
    else {
      uVar11 = SVar42._2_4_ & 0xff;
      uVar12 = SVar42._3_4_ & 0xff;
    }
    in_R8 = (char *)(ulong)(uVar11 + uVar12);
    snprintf(__s,0x400,"lexed_lookahead sym:%s, size:%u",pcVar44);
    ts_parser__log(self_01);
    ts_parser__set_cached_token(self_01,LVar67._0_8_ & 0xffffffff,SStack_130,SVar42);
    pTVar52 = self_01->language;
    if (((ulong)SVar42.ptr & 1) != 0) goto LAB_0012d65d;
LAB_0012d68c:
    TVar33 = (SVar42.ptr)->symbol;
  }
  ts_language_table_entry(pTVar52,(TSStateId)uVar57,TVar33,&TStack_140);
  bVar65 = true;
LAB_0012d6af:
  bVar45 = SVar42.data.symbol;
  paStack_178 = (anon_union_40_3_c1cdc900_for_SubtreeHeapData_17 *)
                CONCAT44(paStack_178._4_4_,(uint)bVar45);
LAB_0012d6be:
  while (uVar43 = TStack_140.action_count, uVar57 = (ulong)TStack_140.action_count, uVar57 != 0) {
    v1 = 0xffffffff;
    lVar63 = CONCAT44(TStack_140.actions._4_4_,(int)TStack_140.actions);
    uVar61 = 0;
    do {
      bVar29 = *(byte *)(lVar63 + 6 + uVar61 * 8) & 0xf;
      if (bVar29 < 4) {
        uVar32 = *(ushort *)(lVar63 + uVar61 * 8);
        pTVar54 = (TSRangeArray *)(ulong)uVar32;
        uVar4 = *(ushort *)(lVar63 + 2 + uVar61 * 8);
        uVar11 = (uint)(short)uVar4;
        in_R8 = (char *)(ulong)uVar11;
        switch(bVar29) {
        case 0:
          if ((uVar11 & 2) == 0) {
            if ((uVar4 & 1) == 0) {
              if (((self_01->lexer).logger.log != (_func_void_void_ptr_TSLogType_char_ptr *)0x0) ||
                 (in_R8 = (char *)pTVar54, SStack_188 = SVar42,
                 self_01->dot_graph_file != (FILE *)0x0)) {
                SStack_188 = SVar42;
                snprintf(__s,0x400,"shift state:%u");
LAB_0012db77:
                ts_parser__log(self_01);
                in_R8 = (char *)pTVar54;
              }
            }
            else {
              if (uVar59 == 0) break;
              if (((self_01->lexer).logger.log != (_func_void_void_ptr_TSLogType_char_ptr *)0x0) ||
                 (in_R8 = (char *)(ulong)uVar59, SStack_188 = SVar42,
                 self_01->dot_graph_file != (FILE *)0x0)) {
                builtin_strncpy(__s,"shift_extra",0xc);
                pTVar54 = (TSRangeArray *)(ulong)uVar59;
                SStack_188 = SVar42;
                goto LAB_0012db77;
              }
            }
            if ((((ulong)SVar42.ptr & 1) == 0) && ((SVar42.ptr)->child_count != 0)) {
              ts_parser__breakdown_lookahead(self_01,&SStack_188,uVar59,self_00);
              SVar42 = SStack_188;
              pTVar52 = self_01->language;
              if (((ulong)SStack_188.ptr & 1) == 0) {
                uVar32 = (SStack_188.ptr)->symbol;
                if (uVar32 < 0xfffe) goto LAB_0012dc53;
LAB_0012dc9d:
                in_R8 = (char *)0x0;
              }
              else {
                uVar32 = (ushort)SStack_188.data.symbol;
LAB_0012dc53:
                if ((uint)uVar32 < pTVar52->token_count) {
                  ts_language_table_entry(pTVar52,uVar59,uVar32,aTStack_120);
                  if (aTStack_120[0].action_count == 0) {
                    in_R8 = (char *)0x0;
                  }
                  else {
                    in_R8 = (char *)(ulong)*(ushort *)
                                            (CONCAT44(aTStack_120[0].actions._4_4_,
                                                      (uint32_t)aTStack_120[0].actions) +
                                            (ulong)(aTStack_120[0].action_count - 1) * 8);
                    bVar45 = *(byte *)(CONCAT44(aTStack_120[0].actions._4_4_,
                                                (uint32_t)aTStack_120[0].actions) + 6 +
                                      (ulong)(aTStack_120[0].action_count - 1) * 8);
                    if (((bVar45 & 0xf) != 0) && ((bVar45 & 0xf) != 3)) goto LAB_0012dc9d;
                  }
                }
                else {
                  in_R8 = (char *)(ulong)pTVar52->parse_table
                                         [(uint)uVar59 * pTVar52->symbol_count + (uint)uVar32];
                }
              }
            }
            if (((ulong)SVar42.ptr & 1) == 0) {
              bVar45 = (byte)(*(uint *)&(SVar42.ptr)->field_0x2c >> 2);
            }
            else {
              bVar45 = (byte)((ulong)SVar42.ptr >> 3);
            }
            if ((bVar45 & 1) != ((byte)uVar4 & 1)) {
              SVar42 = (Subtree)ts_subtree_make_mut(pool,SVar42);
              if (((ulong)SVar42.ptr & 1) == 0) {
                (SVar42.ptr)->field_0x2c = (SVar42.ptr)->field_0x2c | 4;
              }
              else {
                SVar42.ptr = (SubtreeHeapData *)((ulong)SVar42.ptr | 8);
              }
            }
            if (((ulong)SVar42.ptr & 1) == 0) {
              ts_stack_push(self_01->stack,SVar37,SVar42,(SVar42.ptr)->child_count != 0,
                            (TSStateId)in_R8);
              if (((SVar42.ptr)->field_0x2c & 0x40) != 0) {
                pSVar51 = self_01->stack;
                SVar42 = ts_subtree_last_external_token(SVar42);
                ts_stack_set_last_external_token(pSVar51,SVar37,SVar42);
              }
            }
            else {
              ts_stack_push(self_01->stack,SVar37,SVar42,false,(TSStateId)in_R8);
            }
            goto LAB_0012dd83;
          }
          break;
        case 1:
          bVar29 = *(byte *)(lVar63 + 4 + uVar61 * 8);
          bVar3 = *(byte *)(lVar63 + 5 + uVar61 * 8);
          if (((self_01->lexer).logger.log != (_func_void_void_ptr_TSLogType_char_ptr *)0x0) ||
             (self_01->dot_graph_file != (FILE *)0x0)) {
            pcVar44 = "ERROR";
            if (uVar32 != 0xffff) {
              if (uVar32 == 0xfffe) {
                pcVar44 = "_ERROR";
              }
              else {
                pcVar44 = self_01->language->symbol_names[uVar32];
              }
            }
            snprintf(__s,0x400,"reduce sym:%s, child_count:%u",pcVar44,(ulong)bVar29);
            ts_parser__log(self_01);
          }
          in_R8 = (char *)(ulong)uVar11;
          SVar35 = ts_parser__reduce(self_01,SVar37,uVar32,(uint)bVar29,uVar11,(ushort)bVar3,
                                     uVar43 != 1);
          if (SVar35 != 0xffffffff) {
            v1 = SVar35;
          }
          break;
        case 2:
          if (((self_01->lexer).logger.log != (_func_void_void_ptr_TSLogType_char_ptr *)0x0) ||
             (self_01->dot_graph_file != (FILE *)0x0)) {
            builtin_strncpy(__s,"accept",7);
            ts_parser__log(self_01);
          }
          ts_parser__accept(self_01,SVar37,SVar42);
          goto LAB_0012dd94;
        case 3:
          SStack_188 = SVar42;
          if ((((ulong)SVar42.ptr & 1) == 0) && ((SVar42.ptr)->child_count != 0)) {
            ts_parser__breakdown_lookahead(self_01,&SStack_188,0,self_00);
          }
          ts_parser__recover(self_01,SVar37,SStack_188);
LAB_0012dd83:
          if (!bVar65) {
            reusable_node_advance(self_00);
          }
          goto LAB_0012dd94;
        }
      }
      uVar61 = uVar61 + 1;
    } while (uVar57 != uVar61);
    if (v1 == 0xffffffff) break;
    ts_stack_renumber_version(self_01->stack,v1,SVar37);
    if (self_01->dot_graph_file != (FILE *)0x0) {
      ts_stack_print_dot_graph(self_01->stack,self_01->language,self_01->dot_graph_file);
      fputs("\n\n",(FILE *)self_01->dot_graph_file);
    }
    if ((TSRangeArray *)(ulong)(self_01->stack->heads).size <= pTVar47) goto LAB_0012ea52;
    TVar33 = (TSSymbol)paStack_178;
    if (((ulong)SVar42.ptr & 1) == 0) {
      if ((SVar42.ptr)->child_count == 0) {
        TVar33 = (SVar42.ptr)->symbol;
      }
      else {
        TVar33 = ((SVar42.ptr)->field_17).field_0.first_leaf.symbol;
      }
    }
    uVar59 = (&((self_01->stack->heads).contents)->node)[uStack_158]->state;
    ts_language_table_entry(self_01->language,uVar59,TVar33,&TStack_140);
  }
  if (((ulong)SVar42.ptr & 1) == 0) {
    if (((SVar42.ptr)->field_0x2d & 1) != 0) {
      TVar33 = (SVar42.ptr)->symbol;
      goto LAB_0012d83e;
    }
  }
  else {
    TVar33 = (TSSymbol)paStack_178;
    if (((ulong)SVar42.ptr & 0x40) != 0) {
LAB_0012d83e:
      TVar31 = self_01->language->keyword_capture_token;
      if (TVar33 != TVar31) {
        ts_language_table_entry(self_01->language,uVar59,TVar31,&TStack_140);
        if (TStack_140.action_count != 0) goto LAB_0012d94d;
      }
    }
  }
  if (uVar59 == 0) {
    ts_parser__recover(self_01,SVar37,SVar42);
  }
  else {
    _Var28 = ts_parser__breakdown_top_of_stack(self_01,SVar37);
    if (_Var28) goto LAB_0012d6be;
    if (((self_01->lexer).logger.log != (_func_void_void_ptr_TSLogType_char_ptr *)0x0) ||
       (self_01->dot_graph_file != (FILE *)0x0)) {
      builtin_strncpy(__s,"detect_error",0xd);
      ts_parser__log(self_01);
    }
    if (((ulong)SVar42.ptr & 1) == 0) {
      if ((SVar42.ptr)->child_count == 0) {
        TVar33 = (SVar42.ptr)->symbol;
      }
      else {
        TVar33 = ((SVar42.ptr)->field_17).field_0.first_leaf.symbol;
      }
    }
    else {
      TVar33 = (TSSymbol)bVar45;
    }
    ts_stack_pause(self_01->stack,SVar37,TVar33);
    ts_subtree_release(pool,SVar42);
  }
LAB_0012dd94:
  if (self_01->dot_graph_file != (FILE *)0x0) {
    ts_stack_print_dot_graph(self_01->stack,self_01->language,self_01->dot_graph_file);
    fputs("\n\n",(FILE *)self_01->dot_graph_file);
  }
  LVar67 = ts_stack_position(self_01->stack,SVar37);
  uVar40 = LVar67._0_8_;
  uVar12 = LVar67.bytes;
  lVar63 = uStack_158;
  if ((uVar12 <= uStack_f0) && (pTVar47 == (TSRangeArray *)0x0 || uStack_f0 != uVar12))
  goto LAB_0012c35f;
  pSVar51 = self_01->stack;
  uVar11 = (pSVar51->heads).size;
  pTVar54 = (TSRangeArray *)(ulong)uVar11;
  uStack_f0 = uVar12;
  goto LAB_0012de4f;
LAB_0012d94d:
  if (((self_01->lexer).logger.log != (_func_void_void_ptr_TSLogType_char_ptr *)0x0) ||
     (self_01->dot_graph_file != (FILE *)0x0)) {
    if (((ulong)SVar42.ptr & 1) == 0) {
      uVar32 = (SVar42.ptr)->symbol;
    }
    else {
      uVar32 = (ushort)bVar45;
    }
    pTVar52 = self_01->language;
    pcVar44 = "ERROR";
    if (uVar32 != 0xffff) {
      if (uVar32 == 0xfffe) {
        pcVar44 = "_ERROR";
      }
      else {
        pcVar44 = pTVar52->symbol_names[uVar32];
      }
    }
    uVar32 = pTVar52->keyword_capture_token;
    in_R8 = "ERROR";
    if (uVar32 != 0xffff) {
      if (uVar32 == 0xfffe) {
        in_R8 = "_ERROR";
      }
      else {
        in_R8 = pTVar52->symbol_names[uVar32];
      }
    }
    snprintf(__s,0x400,"switch from_keyword:%s, to_word_token:%s",pcVar44);
    ts_parser__log(self_01);
  }
  SVar42 = (Subtree)ts_subtree_make_mut(pool,SVar42);
  uVar32 = self_01->language->keyword_capture_token;
  if (((ulong)SVar42.ptr & 1) == 0) {
    (SVar42.ptr)->symbol = uVar32;
  }
  else {
    if (0xfe < uVar32) {
      __assert_fail("symbol < UINT8_MAX",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Aerijo[P]latex-language-server/third_party/tree-sitter/src/runtime/subtree.h"
                    ,0x9f,"void ts_subtree_set_symbol(MutableSubtree *, TSSymbol)");
    }
    SVar42.ptr = (SubtreeHeapData *)((ulong)SVar42.ptr & 0xffffffffffff00ff | (ulong)uVar32 << 8);
  }
  goto LAB_0012d6af;
LAB_0012cc2e:
  reusable_node_advance(self_00);
LAB_0012cc38:
  pSVar16 = (self_01->token_cache).token.ptr;
  uVar57 = (ulong)uVar59;
  if ((pSVar16 != (SubtreeHeapData *)0x0) && ((self_01->token_cache).byte_index == uVar11)) {
    _Var28 = ts_subtree_external_scanner_state_eq
                       ((self_01->token_cache).last_external_token,SStack_130);
    if (_Var28) {
      if (((ulong)pSVar16 & 1) == 0) {
        TVar33 = pSVar16->symbol;
      }
      else {
        TVar33 = (TSSymbol)(byte)((ulong)pSVar16 >> 8);
      }
      ts_language_table_entry(self_01->language,uVar59,TVar33,&TStack_140);
      SVar42 = (self_01->token_cache).token;
      _Var28 = ts_parser__can_reuse_first_leaf
                         ((TSParser *)self_01->language,uVar59,SVar42,&TStack_140);
      if (_Var28) {
        ts_subtree_retain(SVar42);
        SVar42 = (Subtree)(self_01->token_cache).token.ptr;
        SStack_188 = SVar42;
        if (SVar42.ptr == (SubtreeHeapData *)0x0) goto LAB_0012ccf0;
        bVar65 = true;
        goto LAB_0012d6af;
      }
    }
  }
  SStack_188.ptr = (SubtreeHeapData *)0x0;
LAB_0012ccf0:
  LVar68 = ts_stack_position(self_01->stack,SVar37);
  if (pTVar47 < (TSRangeArray *)(ulong)(self_01->stack->heads).size) {
    pTVar52 = self_01->language;
    uVar32 = pTVar52->lex_modes[uVar57].external_lex_state;
    uStack_1b4 = (uint)uVar32;
    if (uVar32 == 0) {
      p_Var64 = (_Bool *)0x0;
    }
    else {
      p_Var64 = (pTVar52->external_scanner).states + pTVar52->external_token_count * uStack_1b4;
    }
    pSVar16 = (&((self_01->stack->heads).contents)->last_external_token)[uStack_158].ptr;
    uVar32 = pTVar52->lex_modes[uVar57].lex_state;
    bVar65 = uVar59 == 0;
    uStack_17c = 0;
    uVar43 = LVar68.bytes;
    uStack_168 = uVar57;
    if (pLStack_170->bytes != uVar43) {
      ts_lexer_goto(&self_01->lexer,LVar68);
    }
    paStack_178 = &pSVar16->field_17;
    uStack_d0 = 0;
    uStack_160 = 0;
    uStack_15c = 0;
    uStack_d8 = 0;
    uStack_e0 = 0;
    uStack_144 = 0;
    iStack_ec = 0;
    uStack_f8 = 0;
    do {
      while( true ) {
        pLVar1 = &(self_01->lexer).current_position;
        uVar57._0_4_ = pLVar1->bytes;
        uVar57._4_4_ = (pLVar1->extent).row;
        uVar11 = (self_01->lexer).current_position.extent.column;
        LVar69 = *pLVar1;
        if (p_Var64 != (_Bool *)0x0) {
          if (((self_01->lexer).logger.log != (_func_void_void_ptr_TSLogType_char_ptr *)0x0) ||
             (self_01->dot_graph_file != (FILE *)0x0)) {
            snprintf(__s,0x400,"lex_external state:%d, row:%u, column:%u",(ulong)(ushort)uStack_1b4,
                     uVar57 >> 0x20,(ulong)uVar11);
            ts_parser__log(self_01);
          }
          ts_lexer_start(&self_01->lexer);
          if (pSVar16 == (SubtreeHeapData *)0x0) {
            paVar50 = (anon_union_40_3_c1cdc900_for_SubtreeHeapData_17 *)0x0;
            uVar12 = 0;
          }
          else {
            uVar12 = (pSVar16->field_17).external_scanner_state.length;
            paVar50 = paStack_178;
            if (0x18 < uVar12) {
              paVar50 = (anon_union_40_3_c1cdc900_for_SubtreeHeapData_17 *)
                        (paStack_178->field_0).children;
            }
          }
          (*(self_01->language->external_scanner).deserialize)
                    (self_01->external_scanner_payload,(char *)&paVar50->lookahead_char,uVar12);
          _Var28 = (*(self_01->language->external_scanner).scan)
                             (self_01->external_scanner_payload,(TSLexer *)self_01,p_Var64);
          ts_lexer_finish(&self_01->lexer,&uStack_17c);
          if (_Var28) {
            bVar24 = true;
            if ((uint)(undefined4)uVar57 < pLStack_128->bytes) goto LAB_0012d103;
            if (!bVar65) {
              _Var28 = ts_stack_has_advanced_since_error(self_01->stack,SVar37);
              if (_Var28) goto LAB_0012d103;
            }
          }
          if (pLStack_170->bytes != (undefined4)uVar57) {
            ts_lexer_goto(&self_01->lexer,LVar69);
          }
        }
        if (((self_01->lexer).logger.log != (_func_void_void_ptr_TSLogType_char_ptr *)0x0) ||
           (self_01->dot_graph_file != (FILE *)0x0)) {
          snprintf(__s,0x400,"lex_internal state:%d, row:%u, column:%u",(ulong)uVar32,uVar57 >> 0x20
                   ,(ulong)uVar11);
          ts_parser__log(self_01);
        }
        ts_lexer_start(&self_01->lexer);
        _Var28 = (*self_01->language->lex_fn)((TSLexer *)self_01,uVar32);
        ts_lexer_finish(&self_01->lexer,&uStack_17c);
        if (_Var28) {
          bVar24 = false;
          goto LAB_0012d103;
        }
        if (bVar65) break;
        pTVar52 = self_01->language;
        uVar32 = pTVar52->lex_modes->external_lex_state;
        uStack_1b4 = (uint)uVar32;
        if (uVar32 == 0) {
          p_Var64 = (_Bool *)0x0;
        }
        else {
          p_Var64 = (pTVar52->external_scanner).states + pTVar52->external_token_count * uStack_1b4;
        }
        uVar32 = pTVar52->lex_modes->lex_state;
        bVar65 = true;
        if (pLStack_170->bytes != uVar43) {
          ts_lexer_goto(&self_01->lexer,LVar68);
        }
      }
      if ((uStack_f8 & 1) == 0) {
        if (((self_01->lexer).logger.log != (_func_void_void_ptr_TSLogType_char_ptr *)0x0) ||
           (self_01->dot_graph_file != (FILE *)0x0)) {
          builtin_strncpy(__s,"skip_unrecognized_character",0x1c);
          ts_parser__log(self_01);
        }
        uStack_e0._0_4_ = (self_01->lexer).token_start_position.bytes;
        uStack_e0._4_4_ = (self_01->lexer).token_start_position.extent.row;
        uStack_144 = (self_01->lexer).token_start_position.extent.column;
        uStack_d0 = (ulong)uStack_144;
        uStack_d8 = uStack_e0 >> 0x20;
        iStack_ec = (self_01->lexer).data.lookahead;
        uStack_f8 = CONCAT71((uint7)(uint3)((uint)iStack_ec >> 8),1);
        uStack_160 = (undefined4)uStack_e0;
        uStack_15c = uStack_e0._4_4_;
      }
      if (pLStack_170->bytes == uStack_160) {
        if ((self_01->lexer).data.lookahead == 0) goto LAB_0012de18;
        (*(self_01->lexer).data.advance)((TSLexer *)self_01,false);
      }
      uVar61._0_4_ = (self_01->lexer).current_position.bytes;
      uVar61._4_4_ = (self_01->lexer).current_position.extent.row;
      uStack_d8 = uVar61 >> 0x20;
      uStack_d0 = (ulong)(self_01->lexer).current_position.extent.column;
      uStack_160 = (undefined4)uVar61;
      uStack_15c = uVar61._4_4_;
    } while( true );
  }
LAB_0012ea14:
  __assert_fail("(uint32_t)version < (&self->heads)->size",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Aerijo[P]latex-language-server/third_party/tree-sitter/src/runtime/stack.c"
                ,0x1a0,"Subtree ts_stack_last_external_token(const Stack *, StackVersion)");
}

Assistant:

void ts_stack_clear(Stack *self) {
  stack_node_retain(self->base_node);
  for (uint32_t i = 0; i < self->heads.size; i++) {
    stack_head_delete(&self->heads.contents[i], &self->node_pool, self->subtree_pool);
  }
  array_clear(&self->heads);
  array_push(&self->heads, ((StackHead){
    .node = self->base_node,
    .last_external_token = NULL_SUBTREE,
    .status = StackStatusActive,
    .lookahead_when_paused = 0,
  }));
}